

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

bool __thiscall leveldb::Block::Iter::ParseNextKey(Iter *this)

{
  uint32_t uVar1;
  uint64_t uVar2;
  char *pcVar3;
  ulong uVar4;
  uint32_t *in_RDI;
  bool bVar5;
  uint32_t value_length;
  uint32_t non_shared;
  uint32_t shared;
  char *limit;
  char *p;
  undefined4 in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  uint7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint local_28;
  uint local_24;
  
  uVar2 = NextEntryOffset((Iter *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  in_RDI[0x10] = (uint32_t)uVar2;
  if (*(long *)(in_RDI + 0xc) + (ulong)in_RDI[0x10] < *(long *)(in_RDI + 0xc) + (ulong)in_RDI[0xe])
  {
    pcVar3 = DecodeEntry(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_RDI,
                         (uint32_t *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                         (uint32_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if ((pcVar3 != (char *)0x0) && (uVar4 = std::__cxx11::string::size(), local_24 <= uVar4)) {
      std::__cxx11::string::resize((ulong)(in_RDI + 0x12));
      std::__cxx11::string::append((char *)(in_RDI + 0x12),(ulong)pcVar3);
      Slice::Slice((Slice *)&stack0xffffffffffffffc0,pcVar3 + local_28,
                   (ulong)in_stack_ffffffffffffffd4);
      *(char **)(in_RDI + 0x1a) = in_stack_ffffffffffffffc0;
      *(char **)(in_RDI + 0x1c) = in_stack_ffffffffffffffc8;
      while( true ) {
        bVar5 = false;
        if (in_RDI[0x11] + 1 < in_RDI[0xf]) {
          uVar1 = GetRestartPoint((Iter *)(ulong)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac
                                 );
          bVar5 = uVar1 < in_RDI[0x10];
        }
        if (!bVar5) break;
        in_RDI[0x11] = in_RDI[0x11] + 1;
      }
      return true;
    }
    CorruptionError((Iter *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  else {
    in_RDI[0x10] = in_RDI[0xe];
    in_RDI[0x11] = in_RDI[0xf];
  }
  return false;
}

Assistant:

bool ParseNextKey() {
    current_ = (uint32_t)NextEntryOffset();
    const char* p = data_ + current_;
    const char* limit = data_ + restarts_;  // Restarts come right after data
    if (p >= limit) {
      // No more entries to return.  Mark as invalid.
      current_ = restarts_;
      restart_index_ = num_restarts_;
      return false;
    }

    // Decode next entry
    uint32_t shared, non_shared, value_length;
    p = DecodeEntry(p, limit, &shared, &non_shared, &value_length);
    if (p == nullptr || key_.size() < shared) {
      CorruptionError();
      return false;
    } else {
      key_.resize(shared);
      key_.append(p, non_shared);
      value_ = Slice(p + non_shared, value_length);
      while (restart_index_ + 1 < num_restarts_ &&
             GetRestartPoint(restart_index_ + 1) < current_) {
        ++restart_index_;
      }
      return true;
    }
  }